

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::OnSelect(TypeChecker *this)

{
  Type args_1;
  bool bVar1;
  uint in_EAX;
  Result RVar2;
  Result RVar3;
  Result RVar4;
  undefined8 uStack_38;
  Type type;
  
  uStack_38 = (ulong)in_EAX;
  RVar2 = PeekAndCheckType(this,0,I32);
  RVar3 = PeekType(this,1,(Type *)((long)&uStack_38 + 4));
  args_1 = uStack_38._4_4_;
  RVar4 = PeekAndCheckType(this,2,uStack_38._4_4_);
  bVar1 = RVar4.enum_ == Error || (RVar3.enum_ == Error || RVar2.enum_ == Error);
  RVar2.enum_._1_3_ = 0;
  RVar2.enum_._0_1_ = bVar1;
  PrintStackIfFailed<wabt::Type,wabt::Type,wabt::Type>(this,RVar2,"select",I32,args_1,args_1);
  RVar2 = DropTypes(this,3);
  PushType(this,args_1);
  return (Result)(uint)(bVar1 || RVar2.enum_ == Error);
}

Assistant:

Result TypeChecker::OnSelect() {
  Result result = Result::Ok;
  Type type = Type::Any;
  result |= PeekAndCheckType(0, Type::I32);
  result |= PeekType(1, &type);
  result |= PeekAndCheckType(2, type);
  PrintStackIfFailed(result, "select", Type::I32, type, type);
  result |= DropTypes(3);
  PushType(type);
  return result;
}